

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1bdfec::LogisimParser::add_pin_location
          (LogisimParser *this,Position *loc,pin_id_t start,size_t count)

{
  iterator iVar1;
  mapped_type *this_00;
  unordered_map<unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>_>
  *this_01;
  bool bVar2;
  pin_id_t local_58;
  Position local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = *loc;
  while (bVar2 = count != 0, count = count - 1, bVar2) {
    local_58 = start;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,&local_58);
    start = start + 1;
  }
  this_01 = &(this->m_context).m_pin_locs;
  iVar1 = std::
          unordered_map<unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>_>
          ::find(this_01,&loc->m_full);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>
      ._M_cur == (__node_type *)0x0) {
    this_00 = std::
              unordered_map<unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>_>
              ::operator[](this_01,&loc->m_full);
    LogisimConnection::operator=(this_00,(LogisimConnection *)&local_50.field_0);
  }
  Catch::clara::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void LogisimParser::add_pin_location(const Position &loc, pin_id_t start, size_t count) {
    LogisimConnection connection;
    connection.m_position = loc;

    for (size_t i = 0; i < count; ++i) {
       connection.m_pins.push_back(start + i);
    }

    // connect if there is already a pin in the same location
    auto res = m_context.m_pin_locs.find(loc.m_full);
    if (res != m_context.m_pin_locs.end()) {
        // XXX make_connection(connection, res->second);
    } else {
       m_context.m_pin_locs[loc.m_full] = connection;
    }
}